

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O2

void __thiscall
ncnn::ObjectsManager::do_object_boxs_table_nms
          (ObjectsManager *this,ObjectBoxNmsCondition *condition,int start_index,int end_index)

{
  SafeOrderList<ncnn::ObjectBox> *this_00;
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  long lVar4;
  ObjectBoxNmsCondition match;
  
  for (lVar4 = (long)start_index; lVar4 < end_index; lVar4 = lVar4 + 1) {
    this_00 = (this->object_boxs_table).
              super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar4];
    bVar3 = SafeOrderList<ncnn::ObjectBox>::empty(this_00);
    if (!bVar3) {
      uVar1 = condition->top_box;
      uVar2 = condition->nms_threshold;
      match.nms_threshold = (float)uVar2;
      match.top_box = (ObjectBox *)uVar1;
      match._12_4_ = 0;
      SafeOrderList<ncnn::ObjectBox>::remove_all_match<ncnn::ObjectBoxNmsCondition>(this_00,match);
    }
  }
  return;
}

Assistant:

inline void ObjectsManager::do_object_boxs_table_nms(ObjectBoxNmsCondition &condition, int start_index,  int end_index)
{
    for (int i = start_index; i < end_index; i++)
    {
        TObjectBoxs &object_boxs = *object_boxs_table[i];
        if (object_boxs.empty())
        {
            continue;
        }

        object_boxs.remove_all_match(condition);
    }
}